

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_state.hpp
# Opt level: O1

WindowQuantileState<short> * __thiscall
duckdb::QuantileState<short,_duckdb::QuantileStandardType>::GetOrCreateWindowState
          (QuantileState<short,_duckdb::QuantileStandardType> *this)

{
  _Head_base<0UL,_duckdb::WindowQuantileState<short>_*,_false> _Var1;
  type pWVar2;
  
  if ((this->window_state).
      super_unique_ptr<duckdb::WindowQuantileState<short>,_std::default_delete<duckdb::WindowQuantileState<short>_>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::WindowQuantileState<short>,_std::default_delete<duckdb::WindowQuantileState<short>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::WindowQuantileState<short>_*,_std::default_delete<duckdb::WindowQuantileState<short>_>_>
      .super__Head_base<0UL,_duckdb::WindowQuantileState<short>_*,_false>._M_head_impl ==
      (WindowQuantileState<short> *)0x0) {
    _Var1._M_head_impl = (WindowQuantileState<short> *)operator_new(0x60);
    (_Var1._M_head_impl)->qst =
         (unique_ptr<duckdb::QuantileSortTree,_std::default_delete<duckdb::QuantileSortTree>_>)0x0;
    *(undefined8 *)
     &((_Var1._M_head_impl)->prevs).
      super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_> = 0;
    *(pointer *)((long)&(_Var1._M_head_impl)->prevs + 8) = (pointer)0x0;
    *(pointer *)((long)&(_Var1._M_head_impl)->prevs + 0x10) = (pointer)0x0;
    ((_Var1._M_head_impl)->s).
    super_unique_ptr<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_short>,_duckdb::SkipLess<std::pair<unsigned_long,_short>_>_>,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_short>,_duckdb::SkipLess<std::pair<unsigned_long,_short>_>_>_>_>
         = (unique_ptr<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_short>,_duckdb::SkipLess<std::pair<unsigned_long,_short>_>_>,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_short>,_duckdb::SkipLess<std::pair<unsigned_long,_short>_>_>_>_>
            )0x0;
    *(undefined8 *)
     &((_Var1._M_head_impl)->skips).
      super_vector<std::pair<unsigned_long,_short>,_std::allocator<std::pair<unsigned_long,_short>_>_>
         = 0;
    *(pointer *)((long)&(_Var1._M_head_impl)->skips + 8) = (pointer)0x0;
    *(pointer *)((long)&(_Var1._M_head_impl)->skips + 0x10) = (pointer)0x0;
    (_Var1._M_head_impl)->count = 0;
    *(undefined8 *)
     &((_Var1._M_head_impl)->m).super_vector<unsigned_long,_std::allocator<unsigned_long>_> = 0;
    *(pointer *)((long)&(_Var1._M_head_impl)->m + 8) = (pointer)0x0;
    *(pointer *)((long)&(_Var1._M_head_impl)->m + 0x10) = (pointer)0x0;
    (this->window_state).
    super_unique_ptr<duckdb::WindowQuantileState<short>,_std::default_delete<duckdb::WindowQuantileState<short>_>_>
    ._M_t.
    super___uniq_ptr_impl<duckdb::WindowQuantileState<short>,_std::default_delete<duckdb::WindowQuantileState<short>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::WindowQuantileState<short>_*,_std::default_delete<duckdb::WindowQuantileState<short>_>_>
    .super__Head_base<0UL,_duckdb::WindowQuantileState<short>_*,_false>._M_head_impl =
         _Var1._M_head_impl;
  }
  pWVar2 = unique_ptr<duckdb::WindowQuantileState<short>,_std::default_delete<duckdb::WindowQuantileState<short>_>,_true>
           ::operator*(&this->window_state);
  return pWVar2;
}

Assistant:

WindowQuantileState<INPUT_TYPE> &GetOrCreateWindowState() {
		if (!window_state) {
			window_state = make_uniq<WindowQuantileState<INPUT_TYPE>>();
		}
		return *window_state;
	}